

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserSharedInputState.hpp
# Opt level: O2

void __thiscall antlr::ParserInputState::~ParserInputState(ParserInputState *this)

{
  this->_vptr_ParserInputState = (_func_int **)&PTR__ParserInputState_002c1e10;
  if ((this->inputResponsible == true) && (this->input != (TokenBuffer *)0x0)) {
    (*this->input->_vptr_TokenBuffer[1])();
  }
  std::__cxx11::string::~string((string *)&this->filename);
  return;
}

Assistant:

virtual ~ParserInputState()
	{
		if (inputResponsible)
			delete input;
	}